

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int ConnectNMEADevicex(NMEADEVICE *pNMEADevice,char *szCfgFilePath)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0;
  do {
    if (addrsNMEADevice[lVar2] == (void *)0x0) {
      iVar1 = ConnectNMEADevice(pNMEADevice,szCfgFilePath);
      if (iVar1 != 0) {
        return iVar1;
      }
      addrsNMEADevice[lVar2] = pNMEADevice;
      return 0;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0x10);
  return 1;
}

Assistant:

HARDWAREX_API int ConnectNMEADevicex(NMEADEVICE* pNMEADevice, char* szCfgFilePath)
{
	int id = 0, res = EXIT_FAILURE;

	while (addrsNMEADevice[id] != NULL)
	{
		id++;
		if (id >= MAX_NB_DEVICES_HARDWAREX) return EXIT_FAILURE;
	}

	res = ConnectNMEADevice(pNMEADevice, szCfgFilePath);
	if (res != EXIT_SUCCESS) return res;

	addrsNMEADevice[id] = pNMEADevice;

	return EXIT_SUCCESS;
}